

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

SPIRType * __thiscall
spirv_cross::CompilerMSL::get_presumed_input_type
          (SPIRType *__return_storage_ptr__,CompilerMSL *this,SPIRType *ib_type,uint32_t index)

{
  SPIRType *pSVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
  *this_00;
  uint32_t loc;
  
  pSVar1 = get_physical_member_type(this,ib_type,index);
  SPIRType::SPIRType(__return_storage_ptr__,pSVar1);
  Compiler::get_member_decoration
            ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,index,DecorationLocation);
  this_00 = &this->inputs_by_location;
  sVar2 = ::std::
          map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
          ::count(this_00,&loc);
  if (sVar2 != 0) {
    pmVar3 = ::std::
             map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
             ::at(this_00,&loc);
    if (__return_storage_ptr__->vecsize < pmVar3->vecsize) {
      pmVar3 = ::std::
               map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
               ::at(this_00,&loc);
      __return_storage_ptr__->vecsize = pmVar3->vecsize;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SPIRType CompilerMSL::get_presumed_input_type(const SPIRType &ib_type, uint32_t index) const
{
	SPIRType type = get_physical_member_type(ib_type, index);
	uint32_t loc = get_member_decoration(ib_type.self, index, DecorationLocation);
	if (inputs_by_location.count(loc))
	{
		if (inputs_by_location.at(loc).vecsize > type.vecsize)
			type.vecsize = inputs_by_location.at(loc).vecsize;
	}
	return type;
}